

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StackMemory.cpp
# Opt level: O0

void __thiscall Lodtalk::StackMemory::makeBaseFrame(StackMemory *this,Context *context)

{
  StackPage *this_00;
  StackPage *basePage;
  Context *context_local;
  StackMemory *this_local;
  
  this_00 = allocatePage(this);
  if (this->currentPage->previousPage != (StackPage *)0x0) {
    __assert_fail("!currentPage->previousPage",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/StackMemory.cpp"
                  ,0x11b,"void Lodtalk::StackMemory::makeBaseFrame(Context *)");
  }
  StackPage::startUsing(this_00);
  this_00->nextPage = this->currentPage;
  this->currentPage->previousPage = this_00;
  return;
}

Assistant:

void StackMemory::makeBaseFrame(Context *context)
{
    auto basePage = allocatePage();
    assert(!currentPage->previousPage);
    basePage->startUsing();
    basePage->nextPage = currentPage;
    currentPage->previousPage = basePage;


}